

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  uint *puVar1;
  Instruction *pc;
  int nresults_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  puVar1 = fs->f->code + (e->u).info;
  if (e->k == VCALL) {
    *puVar1 = *puVar1 & 0xffffff | (nresults + 1) * 0x1000000;
  }
  else {
    *puVar1 = *puVar1 & 0xffffff | (nresults + 1) * 0x1000000;
    *puVar1 = *puVar1 & 0xffff807f | (uint)fs->freereg << 7;
    luaK_reserveregs(fs,1);
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  Instruction *pc = &getinstruction(fs, e);
  if (e->k == VCALL)  /* expression is an open function call? */
    SETARG_C(*pc, nresults + 1);
  else {
    lua_assert(e->k == VVARARG);
    SETARG_C(*pc, nresults + 1);
    SETARG_A(*pc, fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}